

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O0

ktx_error_code_e
compressedTexImage2DCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  GLenum GVar1;
  ktx_error_code_e kVar2;
  GLsizei in_ECX;
  GLsizei in_EDX;
  GLboolean unaff_BL;
  int in_ESI;
  GLint in_EDI;
  undefined4 in_R8D;
  ulong in_R9;
  void *in_stack_00000008;
  int *in_stack_00000010;
  GLenum type;
  GLenum internalformat;
  GLenum format;
  GLubyte *unpacked;
  ktx_error_code_e result;
  GLenum glerror;
  ktx_cbdata *cbData;
  GLsizei local_8c;
  GLsizei local_6c;
  GLenum GVar3;
  GLenum in_stack_ffffffffffffffb4;
  GLint local_48;
  GLenum in_stack_ffffffffffffffbc;
  ktx_uint32_t in_stack_ffffffffffffffc0;
  GLenum in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  GLsizei GVar4;
  GLint R16Formats;
  ktx_error_code_e local_c;
  
  if (in_R9 < 0x100000000) {
    GVar3 = in_stack_00000010[2];
    local_6c = in_ECX;
    if (in_stack_00000010[5] != 0) {
      local_6c = in_stack_00000010[5];
    }
    GVar4 = in_EDX;
    R16Formats = in_EDI;
    (*gl.glCompressedTexImage2D)
              (*in_stack_00000010 + in_ESI,in_EDI,GVar3,in_EDX,local_6c,0,(GLsizei)in_R9,
               in_stack_00000008);
    GVar1 = (*gl.glGetError)();
    if (((GVar1 == 0x500) || (GVar1 == 0x501)) &&
       ((in_stack_00000010[2] == 0x8d64 ||
        ((0x926f < (uint)in_stack_00000010[2] && ((uint)in_stack_00000010[2] < 0x927a)))))) {
      local_8c = in_ECX;
      kVar2 = _ktxUnpackETC((GLubyte *)CONCAT44(GVar1,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffbc,
                            (GLubyte **)CONCAT44(in_stack_ffffffffffffffb4,in_EDX),
                            (GLenum *)CONCAT44(GVar3,in_EDI),(GLenum *)CONCAT44(in_ECX,in_R8D),
                            (GLenum *)CONCAT44(in_ESI,GVar4),R16Formats,unaff_BL);
      if (kVar2 != KTX_SUCCESS) {
        return kVar2;
      }
      if ((sizedFormats & 1U) == 0) {
        if (local_48 == 0x8051) {
          local_48 = 0x1907;
        }
        else if (local_48 == 0x8058) {
          local_48 = 0x1908;
        }
      }
      if (in_stack_00000010[5] != 0) {
        local_8c = in_stack_00000010[5];
      }
      (*gl.glTexImage2D)(*in_stack_00000010 + in_ESI,R16Formats,local_48,GVar4,local_8c,0,
                         in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb4,
                         (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      GVar1 = (*gl.glGetError)();
    }
    in_stack_00000010[4] = GVar1;
    if (GVar1 == 0) {
      local_c = KTX_SUCCESS;
    }
    else {
      local_c = KTX_GL_ERROR;
    }
  }
  else {
    local_c = KTX_INVALID_OPERATION;
  }
  return local_c;
}

Assistant:

KTX_error_code
compressedTexImage2DCallback(int miplevel, int face,
                             int width, int height,
                             int depth,
                             ktx_uint64_t faceLodSize,
                             void* pixels, void* userdata)
{
    ktx_cbdata* cbData = (ktx_cbdata*)userdata;
    GLenum glerror;
    KTX_error_code result;
    UNUSED(depth);

    if (faceLodSize > UINT32_MAX)
        return KTX_INVALID_OPERATION; // Too big for OpenGL {,ES}.

    // It is simpler to just attempt to load the format, rather than divine
    // which formats are supported by the implementation. In the event of an
    // error, software unpacking can be attempted.
    glCompressedTexImage2D(cbData->glTarget + face, miplevel,
                           cbData->glInternalformat, width,
                           cbData->numLayers == 0 ? (GLuint)height : cbData->numLayers,
                           0,
                           (ktx_uint32_t)faceLodSize, pixels);

    glerror = glGetError();
#if SUPPORT_SOFTWARE_ETC_UNPACK
    // Renderion is returning INVALID_VALUE. Oops!!
    if ((glerror == GL_INVALID_ENUM || glerror == GL_INVALID_VALUE)
        && (cbData->glInternalformat == GL_ETC1_RGB8_OES
            || (cbData->glInternalformat >= GL_COMPRESSED_R11_EAC
                && cbData->glInternalformat <= GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC)
            ))
    {
        GLubyte* unpacked;
        GLenum format, internalformat, type;

        result = _ktxUnpackETC((GLubyte*)pixels, cbData->glInternalformat,
                                  width, height, &unpacked,
                                  &format, &internalformat,
                                  &type, R16Formats, supportsSRGB);
        if (result != KTX_SUCCESS) {
            return result;
        }
        if (!(sizedFormats & _NON_LEGACY_FORMATS)) {
            if (internalformat == GL_RGB8)
                internalformat = GL_RGB;
            else if (internalformat == GL_RGBA8)
                internalformat = GL_RGBA;
        }
        glTexImage2D(cbData->glTarget + face, miplevel,
                     internalformat, width,
                     cbData->numLayers == 0 ? (GLuint)height : cbData->numLayers, 0,
                     format, type, unpacked);

        free(unpacked);
        glerror = glGetError();
    }
#endif

    if ((cbData->glError = glerror) == GL_NO_ERROR) {
        return KTX_SUCCESS;
    } else {
        return KTX_GL_ERROR;
    }
}